

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

void apply_deadliness(int *die_average,wchar_t deadliness)

{
  wchar_t local_1c;
  wchar_t local_14;
  wchar_t i;
  wchar_t deadliness_local;
  int *die_average_local;
  
  local_14 = deadliness;
  if (L'\x96' < deadliness) {
    local_14 = L'\x96';
  }
  if (local_14 < L'\xffffff6a') {
    local_14 = L'\xffffff6a';
  }
  if (local_14 < L'\0') {
    if (local_14 < L'\0') {
      local_1c = -local_14;
    }
    else {
      local_1c = local_14;
    }
    if (deadliness_conversion[local_1c] < 100) {
      *die_average = (100 - (uint)deadliness_conversion[local_1c]) * *die_average;
    }
    else {
      *die_average = 0;
    }
  }
  else {
    *die_average = (deadliness_conversion[local_14] + 100) * *die_average;
  }
  return;
}

Assistant:

void apply_deadliness(int *die_average, int deadliness)
{
	int i;

	/* Paranoia - ensure legal table access. */
	if (deadliness > 150)
		deadliness = 150;
	if (deadliness < -150)
		deadliness = -150;

	/* Deadliness is positive - damage is increased */
	if (deadliness >= 0) {
		i = deadliness_conversion[deadliness];

		*die_average *= (100 + i);
	}

	/* Deadliness is negative - damage is decreased */
	else {
		i = deadliness_conversion[ABS(deadliness)];

		if (i >= 100)
			*die_average = 0;
		else
			*die_average *= (100 - i);
	}
}